

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void move_map(tgestate_t *state)

{
  uint8_t *puVar1;
  byte bVar2;
  uint8_t uVar3;
  byte bVar4;
  byte bVar5;
  
  if (((state->room_index == '\0') && ((state->vischars[0].counter_and_flags & 0x40) == 0)) &&
     (bVar2 = (state->vischars[0].anim)->map_direction, bVar2 != 0xff)) {
    bVar2 = state->vischars[0].animindex >> 6 & 2 ^ bVar2;
    uVar3 = 0xc0;
    if (0xfd < (byte)(bVar2 - 3)) {
      uVar3 = '\0';
    }
    if (uVar3 != (state->map_position).x) {
      uVar3 = '|';
      if (1 < bVar2) {
        uVar3 = '\0';
      }
      if (uVar3 != (state->map_position).y) {
        bVar4 = (1 < bVar2) * '\x02' + state->move_map_y + 1;
        bVar5 = bVar4 & 3;
        state->move_map_y = bVar5;
        (state->game_window_offset).x = bVar5 * '0';
        (state->game_window_offset).y = (uint8_t)(0xff00ff00 >> bVar5 * '\b');
        switch(bVar2) {
        case 0:
          if (bVar5 == 0) {
            puVar1 = &(state->map_position).y;
            *puVar1 = *puVar1 + '\x01';
            get_supertiles(state);
            memmove(state->tile_buf,state->tile_buf + 0x18,0x180);
            memmove(state->window_buf,state->window_buf + 0xc0,0xc00);
            plot_horizontal_tiles_common
                      (state,state->tile_buf + 0x180,state->map_buf + 0x1c,(state->map_position).y,
                       state->window_buf + 0xc00);
            return;
          }
          if ((bVar4 & 1) != 0) {
            shunt_map_left(state);
            return;
          }
          break;
        case 1:
          if (bVar5 == 2) {
            (state->map_position).x = (state->map_position).x + 0xff;
            get_supertiles(state);
            memmove(state->tile_buf + 1,state->tile_buf,0x197);
            memmove(state->window_buf + 1,state->window_buf,0xcbf);
            plot_vertical_tiles_common
                      (state,state->tile_buf,state->map_buf,(state->map_position).x,
                       state->window_buf);
            return;
          }
          if (bVar5 == 0) {
            shunt_map_up_right(state);
            return;
          }
          break;
        case 2:
          if (bVar5 == 3) {
            puVar1 = &(state->map_position).y;
            *puVar1 = *puVar1 + 0xff;
            get_supertiles(state);
            memmove(state->tile_buf + 0x18,state->tile_buf,0x180);
            memmove(state->window_buf + 0xc0,state->window_buf,0xc00);
            plot_horizontal_tiles_common
                      (state,state->tile_buf,state->map_buf,(state->map_position).y,
                       state->window_buf);
            return;
          }
          if ((bVar4 & 1) == 0) {
            shunt_map_right(state);
            return;
          }
          break;
        case 3:
          if (bVar5 == 3) {
            (state->map_position).x = (state->map_position).x + '\x01';
            puVar1 = &(state->map_position).y;
            *puVar1 = *puVar1 + 0xff;
            get_supertiles(state);
            memmove(state->tile_buf + 0x18,state->tile_buf + 1,0x17f);
            memmove(state->window_buf + 0xc0,state->window_buf + 1,0xbff);
            plot_horizontal_tiles_common
                      (state,state->tile_buf,state->map_buf,(state->map_position).y,
                       state->window_buf);
            bVar2 = (state->map_position).x;
            plot_vertical_tiles_common
                      (state,state->tile_buf + 0x17,state->map_buf + (6 - (ulong)((bVar2 & 3) == 0))
                       ,bVar2 - 1,state->window_buf + 0x17);
            return;
          }
          if (bVar5 == 1) {
            (state->map_position).x = (state->map_position).x + '\x01';
            get_supertiles(state);
            memmove(state->tile_buf,state->tile_buf + 1,0x197);
            memmove(state->window_buf,state->window_buf + 1,0xcbf);
            bVar2 = (state->map_position).x;
            plot_vertical_tiles_common
                      (state,state->tile_buf + 0x17,state->map_buf + (6 - (ulong)((bVar2 & 3) == 0))
                       ,bVar2 - 1,state->window_buf + 0x17);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void move_map(tgestate_t *state)
{
  const anim_t *anim;               /* was DE */
  uint8_t       animindex;          /* was C */
  direction_t   map_direction;      /* was A */
  uint8_t       move_map_y;         /* was A */
  uint8_t       x,y;                /* was C,B */
  pos8_t        game_window_offset; /* was HL */

  assert(state != NULL);

  if (state->room_index > room_0_OUTDOORS)
    return; /* Don't move the map when indoors. */

  if (state->vischars[0].counter_and_flags & vischar_BYTE7_DONT_MOVE_MAP)
    return; /* Don't move the map when touch() saw contact. */

  anim      = state->vischars[0].anim;
  animindex = state->vischars[0].animindex;
  map_direction = anim->map_direction;
  if (map_direction == 255)
    return; /* Don't move the map if the current animation inhibits it. */

  if (animindex & vischar_ANIMINDEX_REVERSE)
    map_direction ^= 2; /* Exchange up and down directions when reversed. */

  /* Clamp the map position to (0..192,0..124). */

  if (/* DISABLES CODE */ (0))
  {
    /* Equivalent to: */
    switch (map_direction)
    {
      case direction_TOP_LEFT:     x = 192; y = 124; break;
      case direction_TOP_RIGHT:    x =   0; y = 124; break;
      case direction_BOTTOM_RIGHT: x =   0; y =   0; break;
      case direction_BOTTOM_LEFT:  x = 192; y =   0; break;
    }
  }
  else
  {
    y = 124;
    x = 0;
    /* direction_BOTTOM_* - bottom of the map clamp */
    if (map_direction >= direction_BOTTOM_RIGHT)
      y = 0;
    /* direction_*_LEFT - left of the map clamp */
    if (map_direction != direction_TOP_RIGHT &&
        map_direction != direction_BOTTOM_RIGHT)
      x = 192;
  }

  if (state->map_position.x == x || state->map_position.y == y)
    return; /* Don't move. */

  if (map_direction <= direction_TOP_RIGHT)
    /* Either direction_TOP_* */
    state->move_map_y++;
  else
    /* Either direction_BOTTOM_* */
    state->move_map_y--;
  state->move_map_y &= 3;

  move_map_y = state->move_map_y;
  assert(move_map_y <= 3);

  /* Set the game_window_offset. This is used by plot_game_window (which masks
   * off the top and bottom separately). */
  /* Conv: Simplified. */
  switch (move_map_y)
  {
    case 0: game_window_offset.x = 0x00; game_window_offset.y = 0x00; break;
    case 1: game_window_offset.x = 0x30; game_window_offset.y = 0xFF; break;
    case 2: game_window_offset.x = 0x60; game_window_offset.y = 0x00; break;
    case 3: game_window_offset.x = 0x90; game_window_offset.y = 0xFF; break;
  }

  state->game_window_offset = game_window_offset;

  /* These cases check the move_map_y counter to decide when to shunt up/down,
   * and left/right. */
  /* Conv: Inlined. */
  switch (map_direction)
  {
    case direction_TOP_LEFT:
      /* Used when player moves down-right (map is shifted up-left).
       * Pattern: 0..3 => up/left/none/left. */
      if (move_map_y == 0)
        shunt_map_up(state);
      else if (move_map_y & 1)
        shunt_map_left(state);
      break;

    case direction_TOP_RIGHT:
      /* Used when player moves down-left (map is shifted up-right).
       * Pattern: 0..3 => up-right/none/right/none. */
      if (move_map_y == 0)
        shunt_map_up_right(state);
      else if (move_map_y == 2)
        shunt_map_right(state);
      break;

    case direction_BOTTOM_RIGHT:
      /* Used when player moves up-left (map is shifted down-right).
       * Pattern: 0..3 => right/none/right/down. */
      if (move_map_y == 3)
        shunt_map_down(state);
      else if ((move_map_y & 1) == 0)
        shunt_map_right(state);
      break;

    case direction_BOTTOM_LEFT:
      /* Used when player moves up-right (map is shifted down-left).
       * Pattern: 0..3 => none/left/none/down-left. */
      if (move_map_y == 1)
        shunt_map_left(state);
      else if (move_map_y == 3)
        shunt_map_down_left(state);
      break;
  }
}